

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK4.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::integrators::RK4::RK4
          (RK4 *this,shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *dynamicalSystem)

{
  element_type *peVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  long *in_RDI;
  Index unaff_retaddr;
  SparseMatrix<double,_0,_int> *in_stack_00000008;
  shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *in_stack_ffffffffffffff18;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffff20;
  Index in_stack_ffffffffffffff28;
  SparseMatrix<double,_0,_int> *in_stack_ffffffffffffff30;
  shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *in_stack_ffffffffffffff48;
  FixedStepIntegrator *in_stack_ffffffffffffff50;
  long *col;
  
  col = in_RDI;
  std::shared_ptr<iDynTree::optimalcontrol::DynamicalSystem>::shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  FixedStepIntegrator::FixedStepIntegrator(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::shared_ptr<iDynTree::optimalcontrol::DynamicalSystem>::~shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> *)0x382140);
  *in_RDI = (long)&PTR__RK4_003fb2b8;
  Eigen::SparseMatrix<double,_0,_int>::SparseMatrix(in_stack_ffffffffffffff30);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x382185);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x3821a3);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffff30);
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0x1b));
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3821f7);
  peVar1->isExplicit = true;
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x382205);
  peVar1->numberOfStages = 4;
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x382217);
  std::__cxx11::string::operator=((string *)peVar1,"RK4");
  Eigen::SparseMatrix<double,_0,_int>::resize
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(Index)in_stack_ffffffffffffff20);
  Eigen::SparseMatrix<double,_0,_int>::reserve
            (in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18);
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert(in_stack_00000008,unaff_retaddr,(Index)col);
  *pSVar2 = 0.3333333333333333;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert(in_stack_00000008,unaff_retaddr,(Index)col);
  *pSVar2 = -0.3333333333333333;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert(in_stack_00000008,unaff_retaddr,(Index)col);
  *pSVar2 = 1.0;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert(in_stack_00000008,unaff_retaddr,(Index)col);
  *pSVar2 = 1.0;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert(in_stack_00000008,unaff_retaddr,(Index)col);
  *pSVar2 = -1.0;
  pSVar2 = Eigen::SparseMatrix<double,_0,_int>::insert(in_stack_00000008,unaff_retaddr,(Index)col);
  *pSVar2 = 1.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff20,
             (Index)in_stack_ffffffffffffff18);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18);
  *pSVar3 = 0.125;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18);
  *pSVar3 = 0.375;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18);
  *pSVar3 = 0.375;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18);
  *pSVar3 = 0.125;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff20,
             (Index)in_stack_ffffffffffffff18);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18);
  *pSVar3 = 0.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18);
  *pSVar3 = 0.3333333333333333;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18);
  *pSVar3 = 0.6666666666666666;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffff20,(Index)in_stack_ffffffffffffff18);
  *pSVar3 = 1.0;
  (**(code **)(*in_RDI + 0x78))();
  return;
}

Assistant:

RK4::RK4(const std::shared_ptr<iDynTree::optimalcontrol::DynamicalSystem> dynamicalSystem) : FixedStepIntegrator(dynamicalSystem){
                m_infoData->isExplicit = true;
                m_infoData->numberOfStages = 4;
                m_infoData->name = "RK4";

                m_aCoefficents.resize(4,4);
                m_aCoefficents.reserve(6);
                m_aCoefficents.insert(1,0) =  1.0/3.0;
                m_aCoefficents.insert(2,0) = -1.0/3.0;
                m_aCoefficents.insert(2,1) =   1.0;
                m_aCoefficents.insert(3,0) =   1.0;
                m_aCoefficents.insert(3,1) =  -1.0;
                m_aCoefficents.insert(3,2) =   1.0;

                m_bCoefficients.resize(4);
                m_bCoefficients(0) = 1.0/8.0;
                m_bCoefficients(1) = 3.0/8.0;
                m_bCoefficients(2) = 3.0/8.0;
                m_bCoefficients(3) = 1.0/8.0;
                m_cCoefficients.resize(4);
                m_cCoefficients(0) = 0.0;
                m_cCoefficients(1) = 1.0/3.0;
                m_cCoefficients(2) = 2.0/3.0;
                m_cCoefficients(3) = 1.0;

                allocateBuffers();
            }